

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::LogicalAndExp(SQCompiler *this)

{
  SQUnsignedInteger SVar1;
  SQFuncState *pSVar2;
  undefined2 uVar3;
  SQInteger SVar4;
  SQInteger SVar5;
  uchar uVar6;
  SQInstruction local_58;
  SQInteger SStack_50;
  undefined8 local_48;
  SQLexer *local_38;
  
  BitwiseOrExp(this);
  if (this->_token == 0x10e) {
    local_38 = &this->_lex;
    do {
      SVar4 = SQFuncState::PopTarget(this->_fs);
      SVar5 = SQFuncState::PushTarget(this->_fs,-1);
      uVar6 = (uchar)SVar5;
      local_58._arg0 = uVar6;
      local_58._0_5_ = 0x2b00000000;
      local_58 = (SQInstruction)((ulong)CONCAT12((char)SVar4,local_58._4_2_) << 0x20);
      SQFuncState::AddInstruction(this->_fs,&local_58);
      SVar1 = (this->_fs->_instructions)._size;
      if (SVar5 != SVar4) {
        local_58._0_5_ = 0xa00000000;
        uVar3 = local_58._4_2_;
        local_58.op = (char)uVar3;
        local_58._arg0 = (char)((ushort)uVar3 >> 8);
        local_58._arg1 = (int)SVar4;
        local_58._arg2 = '\0';
        local_58._arg3 = '\0';
        SQFuncState::AddInstruction(this->_fs,&local_58);
      }
      SVar4 = SQLexer::Lex(local_38);
      this->_token = SVar4;
      local_48 = *(undefined8 *)&(this->_es).donot_get;
      local_58 = (SQInstruction)(this->_es).etype;
      SStack_50 = (this->_es).epos;
      (this->_es).etype = 1;
      (this->_es).epos = -1;
      (this->_es).donot_get = false;
      LogicalAndExp(this);
      *(undefined8 *)&(this->_es).donot_get = local_48;
      (this->_es).etype = (SQInteger)local_58;
      (this->_es).epos = SStack_50;
      pSVar2 = this->_fs;
      pSVar2->_optimization = false;
      SVar4 = SQFuncState::PopTarget(pSVar2);
      if (SVar5 != SVar4) {
        local_58._arg0 = uVar6;
        local_58._0_5_ = 0xa00000000;
        uVar3 = local_58._4_2_;
        local_58.op = (char)uVar3;
        local_58._arg0 = (char)((ushort)uVar3 >> 8);
        local_58._arg1 = (int)SVar4;
        local_58._arg2 = '\0';
        local_58._arg3 = '\0';
        SQFuncState::AddInstruction(this->_fs,&local_58);
      }
      pSVar2 = this->_fs;
      pSVar2->_optimization = false;
      SQFuncState::SetInstructionParam(pSVar2,SVar1 - 1,1,(pSVar2->_instructions)._size - SVar1);
      (this->_es).etype = 1;
    } while (this->_token == 0x10e);
  }
  return;
}

Assistant:

void LogicalAndExp()
    {
        BitwiseOrExp();
        for(;;) switch(_token) {
        case TK_AND: {
            SQInteger first_exp = _fs->PopTarget();
            SQInteger trg = _fs->PushTarget();
            _fs->AddInstruction(_OP_AND, trg, 0, first_exp, 0);
            SQInteger jpos = _fs->GetCurrentPos();
            if(trg != first_exp) _fs->AddInstruction(_OP_MOVE, trg, first_exp);
            Lex(); INVOKE_EXP(&SQCompiler::LogicalAndExp);
            _fs->SnoozeOpt();
            SQInteger second_exp = _fs->PopTarget();
            if(trg != second_exp) _fs->AddInstruction(_OP_MOVE, trg, second_exp);
            _fs->SnoozeOpt();
            _fs->SetInstructionParam(jpos, 1, (_fs->GetCurrentPos() - jpos));
            _es.etype = EXPR;
            break;
            }

        default:
            return;
        }
    }